

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O0

int tss_set(tss_t key,void *val)

{
  int iVar1;
  void *val_local;
  tss_t key_local;
  
  iVar1 = pthread_setspecific(key,val);
  val_local._4_4_ = (uint)(iVar1 == 0);
  return val_local._4_4_;
}

Assistant:

int tss_set(tss_t key, void *val)
{
#if defined(_TTHREAD_WIN32_)
  if (TlsSetValue(key, val) == 0)
  {
    return thrd_error;
  }
#else
  if (pthread_setspecific(key, val) != 0)
  {
    return thrd_error;
  }
#endif
  return thrd_success;
}